

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double> *this,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
          *reduced_cost,int r_size,int bk_min,int bk_max)

{
  undefined8 uVar1;
  item *piVar2;
  longdouble *plVar3;
  int iVar4;
  size_type sVar5;
  int *piVar6;
  ulong uVar7;
  __normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item_*,_std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>_>
  _Var8;
  solver_failure *this_00;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  longdouble *plVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  
  if (r_size < 4) {
LAB_005e6cac:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
              ();
LAB_005e6cb1:
    solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
              ();
  }
  else {
    if (bk_max < bk_min) goto LAB_005e6cb1;
    *(int *)(this + 0x74) = bk_min;
    *(int *)(this + 0x78) = bk_max;
    std::
    vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
    ::resize((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::item>_>
              *)(this + 0x20),(ulong)(uint)r_size);
    iVar4 = shared_subvector::init((shared_subvector *)this,(EVP_PKEY_CTX *)(ulong)(uint)r_size);
    if ((char)iVar4 == '\0') goto LAB_005e6cbb;
    sVar5 = shared_subvector::emplace((shared_subvector *)this);
    *(size_type *)(this + 0x70) = sVar5;
    if (sVar5 == 0) {
      if (*(long *)(this + 0x40) != *(long *)(this + 0x38)) {
        *(long *)(this + 0x40) = *(long *)(this + 0x38);
      }
      lVar15 = *(long *)(this + 0x20);
      lVar14 = 0;
      piVar6 = &((reduced_cost->_M_t).
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
                ._M_head_impl)->f;
      do {
        *(longdouble *)(lVar15 + lVar14) = ((rc_data *)(piVar6 + -5))->value;
        *(int *)(lVar15 + 0x28 + lVar14) = piVar6[-1];
        iVar4 = *piVar6;
        *(int *)(lVar15 + 0x24 + lVar14) = iVar4;
        iVar9 = -iVar4;
        if (0 < iVar4) {
          iVar9 = iVar4;
        }
        piVar6 = piVar6 + 8;
        *(int *)(lVar15 + 0x20 + lVar14) = iVar9;
        *(undefined4 *)(lVar15 + 0x2c + lVar14) = 0;
        lVar14 = lVar14 + 0x30;
      } while ((ulong)(uint)r_size * 0x30 != lVar14);
      shared_subvector::check_index((shared_subvector *)this,0);
      if ((ulong)*(uint *)(this + 0x18) != 0) {
        memset(*(void **)this,0,(ulong)*(uint *)(this + 0x18));
      }
      lVar15 = *(long *)(this + 0x20);
      lVar14 = *(long *)(this + 0x28);
      if (lVar15 != lVar14) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar15,lVar14,
                   (int)LZCOUNT((lVar14 - lVar15 >> 4) * -0x5555555555555555) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (lVar15,lVar14);
        lVar15 = *(long *)(this + 0x20);
        lVar14 = *(long *)(this + 0x28);
      }
      iVar4 = *(int *)(this + 0x74);
      iVar9 = *(int *)(this + 0x78);
      lVar13 = (lVar14 - lVar15 >> 4) * -0x5555555555555555;
      if (lVar14 != lVar15) {
        piVar6 = (int *)(lVar15 + 0x24);
        lVar16 = lVar13;
        do {
          if (*piVar6 < 0) {
            iVar4 = iVar4 + piVar6[-1];
            iVar9 = iVar9 + piVar6[-1];
            *(int *)(this + 0x74) = iVar4;
            *(int *)(this + 0x78) = iVar9;
          }
          piVar6 = piVar6 + 0xc;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      *(unkbyte10 *)(lVar14 + -0x20) = *(unkbyte10 *)(lVar14 + -0x30);
      iVar12 = (int)lVar13;
      if (1 < iVar12) {
        lVar14 = (ulong)(iVar12 - 2) * 0x30;
        do {
          *(longdouble *)(lVar15 + 0x10 + lVar14) =
               *(longdouble *)(lVar15 + lVar14) + *(longdouble *)(lVar15 + 0x40 + lVar14);
          lVar14 = lVar14 + -0x30;
        } while (lVar14 != -0x30);
      }
      if (iVar9 == iVar4) {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::solve_equality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *)this);
      }
      else {
        branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double>::solve_inequality
                  ((branch_and_bound_solver<baryonyx::itm::maximize_tag,_long_double> *)this);
      }
      lVar15 = *(long *)(this + 0x28);
      lVar14 = *(long *)(this + 0x20);
      uVar7 = (lVar15 - lVar14 >> 4) * -0x5555555555555555;
      if ((int)uVar7 != 0) {
        lVar13 = *(long *)this;
        lVar16 = *(long *)(this + 8);
        uVar10 = *(uint *)(this + 0x70);
        lVar17 = 0;
        do {
          uVar11 = (ulong)uVar10;
          if (*(int *)(lVar14 + 0x24 + lVar17) < 1) {
            if ((ulong)(lVar16 - lVar13) <= uVar11) goto LAB_005e6ca7;
            bVar19 = *(char *)(lVar13 + uVar11) == '\0';
          }
          else {
            if ((ulong)(lVar16 - lVar13) <= uVar11) {
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
                        ();
LAB_005e6ca7:
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
                        ();
              goto LAB_005e6cac;
            }
            bVar19 = *(char *)(lVar13 + uVar11) != '\0';
          }
          uVar10 = uVar10 + 1;
          *(uint *)(lVar14 + 0x2c + lVar17) = (uint)bVar19;
          lVar17 = lVar17 + 0x30;
        } while ((uVar7 & 0xffffffff) * 0x30 != lVar17);
      }
      if (lVar14 != lVar15) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar14,lVar15,(int)LZCOUNT(uVar7) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (lVar14,lVar15);
      }
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>(std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>&,int,int,int)::_lambda(auto:1_const&)_1_>>
                        (*(undefined8 *)(this + 0x20),*(undefined8 *)(this + 0x28));
      piVar2 = *(item **)(this + 0x28);
      plVar3 = *(longdouble **)(this + 0x20);
      lVar15 = (long)piVar2 - (long)plVar3;
      if (lVar15 != 0) {
        lVar15 = (lVar15 >> 4) * -0x5555555555555555;
        piVar6 = &((reduced_cost->_M_t).
                   super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                   .
                   super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
                  ._M_head_impl)->id;
        plVar18 = plVar3;
        do {
          ((rc_data *)(piVar6 + -4))->value = *plVar18;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)((long)plVar18 + 0x24);
          plVar18 = plVar18 + 3;
          auVar20 = vshufps_avx(auVar20,auVar20,0xe1);
          uVar1 = vmovlps_avx(auVar20);
          *(undefined8 *)piVar6 = uVar1;
          piVar6 = piVar6 + 8;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      if (_Var8._M_current == piVar2) {
        uVar10 = -(uint)(*(int *)((long)plVar3 + 0x2c) == 0) | r_size;
      }
      else {
        uVar10 = (int)((ulong)((long)_Var8._M_current - (long)plVar3) >> 4) * -0x55555555 - 1;
      }
      return uVar10;
    }
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
            ();
LAB_005e6cbb:
  this_00 = (solver_failure *)__cxa_allocate_exception(0x18);
  solver_failure::solver_failure(this_00,no_solver_available);
  __cxa_throw(this_00,&solver_failure::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int solve(R& reduced_cost, int r_size, int bk_min, int bk_max)
    {
        bx_assert(r_size >= 4);
        bx_assert(bk_min <= bk_max);

        b_min = bk_min;
        b_max = bk_max;

        items.resize(r_size);
        if (!subvector.init(r_size))
            throw solver_failure(solver_error_tag::no_solver_available);

        solution = subvector.emplace();

        bx_assert(solution == 0u);

        nodes.clear();

        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].original_factor = reduced_cost[i].f;
            items[i].factor = std::abs(reduced_cost[i].f);
            items[i].result = 0;
        }

        std::fill_n(
          subvector.element_data(solution), subvector.element_size(), 0);

        std::sort(std::begin(items), std::end(items));

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            if (items[i].original_factor < 0) {
                b_min += items[i].factor;
                b_max += items[i].factor;
            }
        }

        // Compute the inversion of the sum z
        items.back().sum_z = items.back().r;
        for (int i = length(items) - 2; i >= 0; --i)
            items[i].sum_z = items[i + 1].sum_z + items[i].r;

        if (b_max == b_min)
            solve_equality();
        else
            solve_inequality();

        for (int i = 0, e = length(items); i != e; ++i) {
            if (items[i].original_factor > 0)
                items[i].result = subvector[solution + i] == 0 ? 0 : 1;
            else
                items[i].result = subvector[solution + i] == 0 ? 1 : 0;
        }

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].original_factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }